

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t *puVar1;
  sbyte sVar2;
  bool *pbVar3;
  long lVar4;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  byte extraout_AL_05;
  byte extraout_AL_06;
  uint32_t uVar5;
  uint extraout_EAX;
  uint uVar6;
  uint extraout_EAX_00;
  uint32_t uVar7;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint32_t *puVar8;
  uint8_t val_00;
  ulong uVar9;
  pointer pBVar10;
  Cache *pCVar11;
  Cache *this_00;
  long lVar12;
  double __x;
  double dVar13;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x_01;
  double __x_02;
  double __x_03;
  
  this->reference_cnt = this->reference_cnt + 1;
  puVar8 = &(this->statistics).write_cnt;
  *puVar8 = *puVar8 + 1;
  puVar8 = cycles;
  uVar5 = getBlockId(this,addr);
  if (uVar5 == 0xffffffff) {
    puVar1 = &(this->statistics).miss_cnt;
    *puVar1 = *puVar1 + 1;
    if (this->write_allocate == false) {
      if (this->lower_cache == (Cache *)0x0) {
        MemoryManager::setByteNoCache(this->memory,addr,val);
        puVar8 = &(this->statistics).cycle_cnt;
        *puVar8 = *puVar8 + 100;
        if (cycles != (uint32_t *)0x0) {
          *cycles = *cycles + 100;
        }
      }
      else {
        setByte(this->lower_cache,addr,val,cycles);
        if (cycles != (uint32_t *)0x0) {
          puVar8 = &(this->statistics).cycle_cnt;
          *puVar8 = *puVar8 + *cycles;
        }
      }
    }
    else {
      if (this->bypass == true) {
        dVar13 = log2(__x);
        dVar13 = log2(dVar13);
        uVar5 = (this->policy).associativity;
        sVar2 = (extraout_AL_00 < 0x21) * (' ' - extraout_AL_00);
        uVar6 = (((addr >> (extraout_EAX & 0x1f)) << sVar2) >> sVar2) * uVar5;
        if (uVar6 + uVar5 <= uVar6) {
LAB_00102fe8:
          dVar13 = log2(dVar13);
          log2(dVar13);
          uVar5 = getTag(this,addr);
          if ((ulong)this->mct_size != 0) {
            sVar2 = (extraout_AL_03 < 0x21) * (' ' - extraout_AL_03);
            uVar9 = 0;
            do {
              dVar13 = extraout_XMM0_Qa;
              if ((this->mct[((addr >> (extraout_EAX_01 & 0x1f)) << sVar2) >> sVar2][uVar9] ==
                   0xffffffffffffffff) ||
                 (this->mct[((addr >> (extraout_EAX_01 & 0x1f)) << sVar2) >> sVar2][uVar9] ==
                  (ulong)uVar5)) goto LAB_00102ef2;
              uVar9 = uVar9 + 1;
            } while (this->mct_size != uVar9);
          }
          pCVar11 = this->lower_cache;
          if (pCVar11 == (Cache *)0x0) {
            if (cycles != (uint32_t *)0x0) {
              *cycles = *cycles + 100;
            }
            puVar8 = &(this->statistics).cycle_cnt;
            *puVar8 = *puVar8 + 100;
            MemoryManager::setByteNoCache(this->memory,addr,val);
            dVar13 = extraout_XMM0_Qa_01;
          }
          else {
            puVar8 = &(this->statistics).cycle_cnt;
            *puVar8 = *puVar8 + (pCVar11->policy).hit_latency;
            setByte(pCVar11,addr,val,cycles);
            dVar13 = extraout_XMM0_Qa_00;
          }
          dVar13 = log2(dVar13);
          log2(dVar13);
          sVar2 = (extraout_AL_04 < 0x21) * (' ' - extraout_AL_04);
          MCTUpdate(this,((addr >> (extraout_EAX_02 & 0x1f)) << sVar2) >> sVar2,addr);
          return;
        }
        pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar9 = (ulong)uVar6;
        if (pBVar10[uVar9].valid == true) {
          pBVar10 = pBVar10 + uVar9 + 1;
          lVar4 = 0;
          do {
            lVar12 = lVar4;
            if (1 - uVar5 == (int)lVar12) break;
            pbVar3 = &pBVar10->valid;
            pBVar10 = pBVar10 + 1;
            lVar4 = lVar12 + -1;
          } while (*pbVar3 != false);
          if ((ulong)(uVar6 + uVar5) <= (uVar9 - lVar12) + 1) goto LAB_00102fe8;
        }
LAB_00102ef2:
        dVar13 = log2(dVar13);
        log2(dVar13);
        uVar6 = addr >> (extraout_EAX_00 & 0x1f);
        puVar8 = (uint32_t *)(ulong)uVar6;
        sVar2 = (extraout_AL_01 < 0x21) * (' ' - extraout_AL_01);
        MCTUpdate(this,(uVar6 << sVar2) >> sVar2,addr);
      }
      loadBlockFromLowerLevel(this,addr,cycles);
      if (this->pre_fetch == true) {
        preFetch(this,addr);
      }
      pCVar11 = this;
      uVar5 = addr;
      uVar7 = getBlockId(this,addr);
      if (uVar7 == 0xffffffff) {
        setByte();
        while( true ) {
          this_00 = pCVar11;
          uVar7 = getBlockId(this_00,uVar5);
          if (uVar7 != 0xffffffff) {
            log2(__x_01);
            pBVar10 = (this_00->blocks).
                      super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                      super__Vector_impl_data._M_start;
            sVar2 = (extraout_AL_05 < 0x21) * (' ' - extraout_AL_05);
            pBVar10[(int)uVar7].dirty = true;
            *(uint8_t *)
             (*(long *)&pBVar10[(int)uVar7].data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + (ulong)((uVar5 << sVar2) >> sVar2)) = val_00;
            if (this_00->write_back != false) {
              return;
            }
            writeBlockToLowerLevel
                      (this_00,(this_00->blocks).
                               super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                               _M_impl.super__Vector_impl_data._M_start + (int)uVar7,puVar8);
            return;
          }
          if (this_00->write_allocate != false) break;
          pCVar11 = this_00->lower_cache;
          if (this_00->lower_cache == (Cache *)0x0) {
            MemoryManager::setByteNoCache(this_00->memory,uVar5,val_00);
            return;
          }
        }
        loadBlockFromLowerLevel(this_00,uVar5,puVar8);
        uVar7 = getBlockId(this_00,uVar5);
        if (uVar7 != 0xffffffff) {
          log2(__x_02);
          pBVar10 = (this_00->blocks).
                    super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar2 = (extraout_AL_06 < 0x21) * (' ' - extraout_AL_06);
          pBVar10[(int)uVar7].dirty = true;
          *(uint8_t *)
           (*(long *)&pBVar10[(int)uVar7].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + (ulong)((uVar5 << sVar2) >> sVar2)) = val_00;
          return;
        }
        setByteCopy();
        log2(__x_03);
        return;
      }
      log2(__x_00);
      sVar2 = (extraout_AL_02 < 0x21) * (' ' - extraout_AL_02);
      (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_start[(int)uVar7].dirty = true;
      PLRUUpdate(this,uVar7);
      pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pBVar10[(int)uVar7].last_reference = this->reference_cnt;
      *(uint8_t *)
       (*(long *)&pBVar10[(int)uVar7].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)((addr << sVar2) >> sVar2)) = val;
    }
  }
  else {
    log2(__x);
    puVar8 = &(this->statistics).hit_cnt;
    *puVar8 = *puVar8 + 1;
    sVar2 = (extraout_AL < 0x21) * (' ' - extraout_AL);
    puVar8 = &(this->statistics).cycle_cnt;
    *puVar8 = *puVar8 + (this->policy).hit_latency;
    (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar5].dirty = true;
    PLRUUpdate(this,uVar5);
    pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl
              .super__Vector_impl_data._M_start;
    pBVar10[(int)uVar5].last_reference = this->reference_cnt;
    *(uint8_t *)
     (*(long *)&pBVar10[(int)uVar5].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)((addr << sVar2) >> sVar2)) = val;
    if (this->write_back == false) {
      writeBlockToLowerLevel
                (this,(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)uVar5,cycles);
    }
    if (cycles != (uint32_t *)0x0) {
      *cycles = *cycles + (this->policy).hit_latency;
    }
  }
  return;
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
    this->reference_cnt++;
    this->statistics.write_cnt++;
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->statistics.hit_cnt++;
        this->statistics.cycle_cnt += this->policy.hit_latency;
        this->blocks[block_id].dirty = true;
        this->PLRUUpdate(block_id);
        this->blocks[block_id].last_reference = this->reference_cnt;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
//            this->statistics.cycle_cnt += this->policy.miss_latency;
        }
        if (cycles) {
            *cycles += this->policy.hit_latency;
        }
        return;
    }

    this->statistics.miss_cnt++;
//    this->statistics.cycle_cnt += this->policy.miss_latency;

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
            this->statistics.cycle_cnt += 100;
            if (cycles)
                *cycles += 100;
        } else {
            this->lower_cache->setByte(addr, val, cycles);
            if (cycles)
                this->statistics.cycle_cnt += *cycles;
        }
    } else {
        if (this->bypass) {
            if (this->cacheSetFull(getId(addr))) {
                bool next_level = true;
                uint32_t set_id = getId(addr);
                uint32_t tag = getTag(addr);
                for (int tmp = 0; tmp < this->mct_size; tmp++) {
                    if (mct[set_id][tmp] == (uint64_t) -1 || mct[set_id][tmp] == tag) {
                        next_level = false;
                        break;
                    }
                }
                if (next_level) {
                    if (this->lower_cache == nullptr) {
                        if (cycles)
                            *cycles += 100;
                        this->statistics.cycle_cnt += 100;
                        this->memory->setByteNoCache(addr, val);
                    } else {
                        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
                        this->lower_cache->setByte(addr, val, cycles);
                    }
                    MCTUpdate(getId(addr), addr);
                    return;
                }
            }
            MCTUpdate(getId(addr), addr);
        }
        this->loadBlockFromLowerLevel(addr, cycles);
        if (this->pre_fetch)
            preFetch(addr);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->PLRUUpdate(block_id);
            this->blocks[block_id].last_reference = this->reference_cnt;
            this->blocks[block_id].data[offset] = val;
//            if (cycles)
//                *cycles += this->policy.hit_latency;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}